

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

int Au_ManFindNtk(Au_Man_t *p,char *pName)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(p->vNtks).nSize;
  if (1 < lVar2) {
    lVar3 = 1;
    do {
      if (lVar2 == lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = strcmp(*(p->vNtks).pArray[lVar3],pName);
      if (iVar1 == 0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return -1;
}

Assistant:

int Au_ManFindNtk( Au_Man_t * p, char * pName )
{
    Au_Ntk_t * pNtk;
    int i;
    Au_ManForEachNtk( p, pNtk, i )
        if ( !strcmp(Au_NtkName(pNtk), pName) )
            return i;
    return -1;
}